

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# setup_common.cpp
# Opt level: O1

void __thiscall
ChainTestingSetup::ChainTestingSetup(ChainTestingSetup *this,ChainType chainType,TestOpts opts)

{
  function<void_()> *pfVar1;
  unique_ptr<CScheduler,_std::default_delete<CScheduler>_> *this_00;
  CTxMemPool *__ptr;
  SignalInterrupt *pSVar2;
  KernelNotifications *pKVar3;
  undefined8 uVar4;
  Options opts_00;
  base_blob<256U> *pbVar5;
  _Alloc_hider __p_00;
  CChainParams *pCVar6;
  CScheduler *pCVar7;
  CScheduler *pCVar8;
  ValidationSignals *this_01;
  CTxMemPool *this_02;
  Warnings *pWVar9;
  SignalInterrupt **ppSVar10;
  unique_ptr<node::Warnings,_std::default_delete<node::Warnings>_> *puVar11;
  KernelNotifications *pKVar12;
  _func_void__Any_data_ptr *__tmp_2;
  long lVar13;
  vector<const_char_*,_std::allocator<const_char_*>_> *in_RDX;
  _func_bool__Any_data_ptr__Any_data_ptr__Manager_operation *__tmp_1;
  pointer __p;
  undefined8 *puVar14;
  undefined8 *puVar15;
  pointer __p_1;
  long in_FS_OFFSET;
  byte bVar16;
  _Any_data __tmp;
  bilingual_str error;
  TestOpts in_stack_fffffffffffffe48;
  undefined1 auVar17 [32];
  undefined1 in_stack_fffffffffffffe68 [72];
  _Any_data local_138;
  _Manager_type local_128;
  _Invoker_type p_Stack_120;
  _Tuple_impl<0UL,_CScheduler_*,_std::default_delete<CScheduler>_> *local_118;
  undefined8 uStack_110;
  undefined1 local_100 [24];
  CFeeRate CStack_e8;
  CFeeRate local_e0;
  undefined4 local_d8;
  undefined1 local_d4;
  vector<const_char_*,_std::allocator<const_char_*>_> local_98;
  undefined4 local_80;
  undefined1 local_7c;
  bilingual_str local_78;
  long local_38;
  
  bVar16 = 0;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  std::vector<const_char_*,_std::allocator<const_char_*>_>::vector(&local_98,in_RDX);
  local_7c = *(undefined1 *)
              ((long)&in_RDX[1].super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                      _M_impl.super__Vector_impl_data._M_start + 4);
  local_80 = *(undefined4 *)
              &in_RDX[1].super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
               super__Vector_impl_data._M_start;
  BasicTestingSetup::BasicTestingSetup
            (&this->super_BasicTestingSetup,chainType,in_stack_fffffffffffffe48);
  if (local_98.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_98.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_98.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_98.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  (this->m_cache_sizes).coins = 0;
  (this->m_cache_sizes).tx_index = 0;
  (this->m_cache_sizes).block_tree_db = 0;
  (this->m_cache_sizes).coins_db = 0;
  (this->m_cache_sizes).filter_index = 0;
  this->m_coins_db_in_memory = true;
  this->m_block_tree_db_in_memory = true;
  pfVar1 = &this->m_make_chainman;
  *(undefined8 *)&(this->m_make_chainman).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->m_make_chainman).super__Function_base._M_functor + 8) = 0;
  (this->m_make_chainman).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->m_make_chainman)._M_invoker = (_Invoker_type)0x0;
  pCVar6 = Params();
  if (*(char *)((long)&in_RDX[1].super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                       _M_impl.super__Vector_impl_data._M_start + 3) == '\x01') {
    pCVar7 = (CScheduler *)operator_new(0x98);
    CScheduler::CScheduler(pCVar7);
    this_00 = &(this->super_BasicTestingSetup).m_node.scheduler;
    local_100._0_8_ = (__uniq_ptr_impl<CScheduler,_std::default_delete<CScheduler>_>)0x0;
    std::__uniq_ptr_impl<CScheduler,_std::default_delete<CScheduler>_>::reset
              ((__uniq_ptr_impl<CScheduler,_std::default_delete<CScheduler>_> *)this_00,pCVar7);
    std::unique_ptr<CScheduler,_std::default_delete<CScheduler>_>::~unique_ptr
              ((unique_ptr<CScheduler,_std::default_delete<CScheduler>_> *)local_100);
    local_78.original._M_dataplus._M_p = (pointer)0x0;
    local_100._0_8_ = operator_new(0x20);
    *(undefined ***)local_100._0_8_ = &PTR___State_013b3330;
    *(ChainTestingSetup **)(local_100._0_8_ + 8) = this;
    (((NodeContext *)(local_100._0_8_ + 0x10))->kernel)._M_t.
    super___uniq_ptr_impl<kernel::Context,_std::default_delete<kernel::Context>_>._M_t.
    super__Tuple_impl<0UL,_kernel::Context_*,_std::default_delete<kernel::Context>_>.
    super__Head_base<0UL,_kernel::Context_*,_false>._M_head_impl = (Context *)0xf98b71;
    (((unique_ptr<ECC_Context,_std::default_delete<ECC_Context>_> *)(local_100._0_8_ + 0x18))->_M_t)
    .super___uniq_ptr_impl<ECC_Context,_std::default_delete<ECC_Context>_>._M_t.
    super__Tuple_impl<0UL,_ECC_Context_*,_std::default_delete<ECC_Context>_>.
    super__Head_base<0UL,_ECC_Context_*,_false>._M_head_impl = (ECC_Context *)util::TraceThread;
    std::thread::_M_start_thread(&local_78,local_100,0);
    if ((_Tuple_impl<0UL,_CScheduler_*,_std::default_delete<CScheduler>_>)local_100._0_8_ !=
        (CScheduler *)0x0) {
      (**(code **)(*(long *)local_100._0_8_ + 8))();
    }
    pCVar7 = (this_00->_M_t).super___uniq_ptr_impl<CScheduler,_std::default_delete<CScheduler>_>.
             _M_t.super__Tuple_impl<0UL,_CScheduler_*,_std::default_delete<CScheduler>_>.
             super__Head_base<0UL,_CScheduler_*,_false>._M_head_impl;
    if ((native_handle_type)(pCVar7->m_service_thread)._M_id != 0) goto LAB_00846486;
    (pCVar7->m_service_thread)._M_id = (id)local_78.original._M_dataplus._M_p;
    pCVar8 = (CScheduler *)operator_new(0x58);
    (pCVar8->m_service_thread)._M_id._M_thread = (native_handle_type)&PTR__SerialTaskRunner_013bbc58
    ;
    *(CScheduler **)&(pCVar8->newTaskMutex).super_mutex.super___mutex_base._M_mutex = pCVar7;
    *(undefined8 *)((long)&(pCVar8->newTaskMutex).super_mutex.super___mutex_base._M_mutex + 8) = 0;
    *(undefined8 *)((long)&(pCVar8->newTaskMutex).super_mutex.super___mutex_base._M_mutex + 0x10) =
         0;
    (pCVar8->newTaskMutex).super_mutex.super___mutex_base._M_mutex.__data.__list.__prev =
         (__pthread_internal_list *)0x0;
    (pCVar8->newTaskMutex).super_mutex.super___mutex_base._M_mutex.__data.__list.__next =
         (__pthread_internal_list *)0x0;
    *(undefined8 *)&pCVar8->newTaskScheduled = 0;
    *(undefined1 **)&pCVar8->field_0x40 = &pCVar8->field_0x38;
    *(undefined1 **)&pCVar8->field_0x38 = &pCVar8->field_0x38;
    *(undefined8 *)&pCVar8->field_0x48 = 0;
    pCVar8->field_0x50 = 0;
    this_01 = (ValidationSignals *)operator_new(8);
    local_100._0_8_ = pCVar8;
    ValidationSignals::ValidationSignals
              (this_01,(unique_ptr<util::TaskRunnerInterface,_std::default_delete<util::TaskRunnerInterface>_>
                        )local_100);
    local_78.original._M_dataplus._M_p = (pointer)this_01;
    if ((CScheduler *)local_100._0_8_ != (CScheduler *)0x0) {
      (**(code **)((((thread *)local_100._0_8_)->_M_id)._M_thread + 8))();
    }
    __p_00._M_p = local_78.original._M_dataplus._M_p;
    local_78.original._M_dataplus._M_p = (pointer)0x0;
    std::__uniq_ptr_impl<ValidationSignals,_std::default_delete<ValidationSignals>_>::reset
              ((__uniq_ptr_impl<ValidationSignals,_std::default_delete<ValidationSignals>_> *)
               &(this->super_BasicTestingSetup).m_node.validation_signals,(pointer)__p_00._M_p);
    std::unique_ptr<ValidationSignals,_std::default_delete<ValidationSignals>_>::~unique_ptr
              ((unique_ptr<ValidationSignals,_std::default_delete<ValidationSignals>_> *)&local_78);
  }
  local_78.original._M_dataplus._M_p = (pointer)&local_78.original.field_2;
  local_78.original._M_string_length = 0;
  local_78.original.field_2._M_local_buf[0] = '\0';
  local_78.translated._M_dataplus._M_p = (pointer)&local_78.translated.field_2;
  local_78.translated._M_string_length = 0;
  local_78.translated.field_2._M_local_buf[0] = '\0';
  MemPoolOptionsForTest((Options *)local_100,&(this->super_BasicTestingSetup).m_node);
  this_02 = (CTxMemPool *)operator_new(0x248);
  puVar14 = (undefined8 *)local_100;
  puVar15 = (undefined8 *)&stack0xfffffffffffffe48;
  for (lVar13 = 0xd; lVar13 != 0; lVar13 = lVar13 + -1) {
    *puVar15 = *puVar14;
    puVar14 = puVar14 + (ulong)bVar16 * -2 + 1;
    puVar15 = puVar15 + (ulong)bVar16 * -2 + 1;
  }
  auVar17 = in_stack_fffffffffffffe68._32_32_;
  opts_00.min_relay_feerate.nSatoshisPerK = in_stack_fffffffffffffe68._0_8_;
  opts_00.dust_relay_feerate.nSatoshisPerK = in_stack_fffffffffffffe68._8_8_;
  opts_00.max_datacarrier_bytes.super__Optional_base<unsigned_int,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_int> =
       (_Optional_base<unsigned_int,_true,_true>)
       (_Optional_base<unsigned_int,_true,_true>)in_stack_fffffffffffffe68._16_8_;
  opts_00.permit_bare_multisig = (bool)in_stack_fffffffffffffe68[0x18];
  opts_00.require_standard = (bool)in_stack_fffffffffffffe68[0x19];
  opts_00.full_rbf = (bool)in_stack_fffffffffffffe68[0x1a];
  opts_00.persist_v1_dat = (bool)in_stack_fffffffffffffe68[0x1b];
  opts_00._60_4_ = in_stack_fffffffffffffe68._28_4_;
  opts_00.limits.ancestor_count = auVar17._0_8_;
  opts_00.limits.ancestor_size_vbytes = auVar17._8_8_;
  opts_00.limits.descendant_count = auVar17._16_8_;
  opts_00.limits.descendant_size_vbytes = auVar17._24_8_;
  opts_00.signals = (ValidationSignals *)in_stack_fffffffffffffe68._64_8_;
  opts_00._0_32_ = in_stack_fffffffffffffe48;
  CTxMemPool::CTxMemPool(this_02,opts_00,&local_78);
  local_138._M_unused._M_object = (CTxMemPool *)0x0;
  __ptr = (this->super_BasicTestingSetup).m_node.mempool._M_t.
          super___uniq_ptr_impl<CTxMemPool,_std::default_delete<CTxMemPool>_>._M_t.
          super__Tuple_impl<0UL,_CTxMemPool_*,_std::default_delete<CTxMemPool>_>.
          super__Head_base<0UL,_CTxMemPool_*,_false>._M_head_impl;
  (this->super_BasicTestingSetup).m_node.mempool._M_t.
  super___uniq_ptr_impl<CTxMemPool,_std::default_delete<CTxMemPool>_>._M_t.
  super__Tuple_impl<0UL,_CTxMemPool_*,_std::default_delete<CTxMemPool>_>.
  super__Head_base<0UL,_CTxMemPool_*,_false>._M_head_impl = this_02;
  if (__ptr != (CTxMemPool *)0x0) {
    std::default_delete<CTxMemPool>::operator()
              ((default_delete<CTxMemPool> *)&(this->super_BasicTestingSetup).m_node.mempool,__ptr);
  }
  if ((CTxMemPool *)local_138._M_unused._0_8_ != (CTxMemPool *)0x0) {
    std::default_delete<CTxMemPool>::operator()
              ((default_delete<CTxMemPool> *)local_138._M_pod_data,
               (CTxMemPool *)local_138._M_unused._0_8_);
  }
  local_100[0] = local_78.original._M_string_length == 0;
  inline_assertion_check<true,bool>
            ((bool *)local_100,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util/setup_common.cpp"
             ,0xde,"ChainTestingSetup","error.empty()");
  pWVar9 = (Warnings *)operator_new(0x58);
  ::node::Warnings::Warnings(pWVar9);
  puVar11 = &(this->super_BasicTestingSetup).m_node.warnings;
  local_100._0_8_ = (__uniq_ptr_impl<CScheduler,_std::default_delete<CScheduler>_>)0x0;
  std::__uniq_ptr_impl<node::Warnings,_std::default_delete<node::Warnings>_>::reset
            ((__uniq_ptr_impl<node::Warnings,_std::default_delete<node::Warnings>_> *)puVar11,pWVar9
            );
  std::unique_ptr<node::Warnings,_std::default_delete<node::Warnings>_>::~unique_ptr
            ((unique_ptr<node::Warnings,_std::default_delete<node::Warnings>_> *)local_100);
  ::node::CalculateCacheSizes((CacheSizes *)local_100,&(this->super_BasicTestingSetup).m_args,0);
  (this->m_cache_sizes).filter_index = local_e0.nSatoshisPerK;
  (this->m_cache_sizes).coins = local_100._16_8_;
  (this->m_cache_sizes).tx_index = CStack_e8.nSatoshisPerK;
  (this->m_cache_sizes).block_tree_db = local_100._0_8_;
  (this->m_cache_sizes).coins_db = local_100._8_8_;
  ppSVar10 = inline_assertion_check<true,util::SignalInterrupt*&>
                       (&(this->super_BasicTestingSetup).m_node.shutdown,
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util/setup_common.cpp"
                        ,0xe3,"ChainTestingSetup","m_node.shutdown");
  pSVar2 = *ppSVar10;
  puVar11 = inline_assertion_check<true,std::unique_ptr<node::Warnings,std::default_delete<node::Warnings>>&>
                      (puVar11,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util/setup_common.cpp"
                       ,0xe3,"ChainTestingSetup","m_node.warnings");
  pWVar9 = (puVar11->_M_t).
           super___uniq_ptr_impl<node::Warnings,_std::default_delete<node::Warnings>_>._M_t.
           super__Tuple_impl<0UL,_node::Warnings_*,_std::default_delete<node::Warnings>_>.
           super__Head_base<0UL,_node::Warnings_*,_false>._M_head_impl;
  pKVar12 = (KernelNotifications *)operator_new(0xa0);
  (pKVar12->super_Notifications)._vptr_Notifications =
       (_func_int **)&PTR__KernelNotifications_013b6658;
  pKVar12->m_stop_at_height = 0;
  pKVar12->m_shutdown_on_fatal_error = true;
  *(undefined8 *)&(pKVar12->m_tip_block_mutex).super_mutex.super___mutex_base = 0;
  *(undefined8 *)((long)&(pKVar12->m_tip_block_mutex).super_mutex.super___mutex_base._M_mutex + 8) =
       0;
  *(undefined8 *)
   ((long)&(pKVar12->m_tip_block_mutex).super_mutex.super___mutex_base._M_mutex + 0x10) = 0;
  (pKVar12->m_tip_block_mutex).super_mutex.super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (pKVar12->m_tip_block_mutex).super_mutex.super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  std::condition_variable::condition_variable(&pKVar12->m_tip_block_cv);
  pbVar5 = &(pKVar12->m_tip_block).super_base_blob<256U>;
  (pbVar5->m_data)._M_elems[0x10] = '\0';
  (pbVar5->m_data)._M_elems[0x11] = '\0';
  (pbVar5->m_data)._M_elems[0x12] = '\0';
  (pbVar5->m_data)._M_elems[0x13] = '\0';
  (pbVar5->m_data)._M_elems[0x14] = '\0';
  (pbVar5->m_data)._M_elems[0x15] = '\0';
  (pbVar5->m_data)._M_elems[0x16] = '\0';
  (pbVar5->m_data)._M_elems[0x17] = '\0';
  pbVar5 = &(pKVar12->m_tip_block).super_base_blob<256U>;
  (pbVar5->m_data)._M_elems[0x18] = '\0';
  (pbVar5->m_data)._M_elems[0x19] = '\0';
  (pbVar5->m_data)._M_elems[0x1a] = '\0';
  (pbVar5->m_data)._M_elems[0x1b] = '\0';
  (pbVar5->m_data)._M_elems[0x1c] = '\0';
  (pbVar5->m_data)._M_elems[0x1d] = '\0';
  (pbVar5->m_data)._M_elems[0x1e] = '\0';
  (pbVar5->m_data)._M_elems[0x1f] = '\0';
  *(undefined8 *)&(pKVar12->m_tip_block).super_base_blob<256U>.m_data = 0;
  pbVar5 = &(pKVar12->m_tip_block).super_base_blob<256U>;
  (pbVar5->m_data)._M_elems[8] = '\0';
  (pbVar5->m_data)._M_elems[9] = '\0';
  (pbVar5->m_data)._M_elems[10] = '\0';
  (pbVar5->m_data)._M_elems[0xb] = '\0';
  (pbVar5->m_data)._M_elems[0xc] = '\0';
  (pbVar5->m_data)._M_elems[0xd] = '\0';
  (pbVar5->m_data)._M_elems[0xe] = '\0';
  (pbVar5->m_data)._M_elems[0xf] = '\0';
  pKVar12->m_shutdown = pSVar2;
  pKVar12->m_exit_status = &(this->super_BasicTestingSetup).m_node.exit_status;
  pKVar12->m_warnings = pWVar9;
  pKVar3 = (this->super_BasicTestingSetup).m_node.notifications._M_t.
           super___uniq_ptr_impl<node::KernelNotifications,_std::default_delete<node::KernelNotifications>_>
           ._M_t.
           super__Tuple_impl<0UL,_node::KernelNotifications_*,_std::default_delete<node::KernelNotifications>_>
           .super__Head_base<0UL,_node::KernelNotifications_*,_false>._M_head_impl;
  (this->super_BasicTestingSetup).m_node.notifications._M_t.
  super___uniq_ptr_impl<node::KernelNotifications,_std::default_delete<node::KernelNotifications>_>.
  _M_t.
  super__Tuple_impl<0UL,_node::KernelNotifications_*,_std::default_delete<node::KernelNotifications>_>
  .super__Head_base<0UL,_node::KernelNotifications_*,_false>._M_head_impl = pKVar12;
  if (pKVar3 != (KernelNotifications *)0x0) {
    (*(pKVar3->super_Notifications)._vptr_Notifications[1])();
  }
  local_100._0_8_ = this;
  local_100._8_8_ = pCVar6;
  std::vector<const_char_*,_std::allocator<const_char_*>_>::vector
            ((vector<const_char_*,_std::allocator<const_char_*>_> *)(local_100 + 0x10),in_RDX);
  local_d4 = *(undefined1 *)
              ((long)&in_RDX[1].super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                      _M_impl.super__Vector_impl_data._M_start + 4);
  local_d8 = *(undefined4 *)
              &in_RDX[1].super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
               super__Vector_impl_data._M_start;
  local_128 = (_Manager_type)0x0;
  p_Stack_120 = (_Invoker_type)0x0;
  local_138._M_unused._M_object = (void *)0x0;
  local_138._8_8_ = 0;
  local_118 = (_Tuple_impl<0UL,_CScheduler_*,_std::default_delete<CScheduler>_> *)operator_new(0x30)
  ;
  local_118->super__Head_base<0UL,_CScheduler_*,_false> =
       (_Head_base<0UL,_CScheduler_*,_false>)local_100._0_8_;
  local_118[1].super__Head_base<0UL,_CScheduler_*,_false>._M_head_impl =
       (CScheduler *)local_100._8_8_;
  local_118[2].super__Head_base<0UL,_CScheduler_*,_false>._M_head_impl =
       (CScheduler *)local_100._16_8_;
  local_118[3].super__Head_base<0UL,_CScheduler_*,_false>._M_head_impl =
       (CScheduler *)CStack_e8.nSatoshisPerK;
  local_118[4].super__Head_base<0UL,_CScheduler_*,_false>._M_head_impl =
       (CScheduler *)local_e0.nSatoshisPerK;
  local_100._16_8_ = (CScheduler *)0x0;
  CStack_e8.nSatoshisPerK = 0;
  local_e0.nSatoshisPerK = 0;
  *(undefined1 *)((long)&local_118[5].super__Head_base<0UL,_CScheduler_*,_false>._M_head_impl + 4) =
       *(undefined1 *)
        ((long)&in_RDX[1].super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                super__Vector_impl_data._M_start + 4);
  *(undefined4 *)&local_118[5].super__Head_base<0UL,_CScheduler_*,_false> =
       *(undefined4 *)
        &in_RDX[1].super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
         super__Vector_impl_data._M_start;
  uStack_110 = local_138._8_8_;
  local_138._M_unused._0_8_ = (undefined8)*(undefined8 *)&(pfVar1->super__Function_base)._M_functor;
  uVar4 = *(undefined8 *)((long)&(this->m_make_chainman).super__Function_base._M_functor + 8);
  *(_Tuple_impl<0UL,_CScheduler_*,_std::default_delete<CScheduler>_> **)
   &(pfVar1->super__Function_base)._M_functor = local_118;
  *(undefined8 *)((long)&(this->m_make_chainman).super__Function_base._M_functor + 8) =
       local_138._8_8_;
  local_128 = (this->m_make_chainman).super__Function_base._M_manager;
  (this->m_make_chainman).super__Function_base._M_manager =
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util/setup_common.cpp:229:23)>
       ::_M_manager;
  p_Stack_120 = (this->m_make_chainman)._M_invoker;
  (this->m_make_chainman)._M_invoker =
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util/setup_common.cpp:229:23)>
       ::_M_invoke;
  local_138._8_8_ = uVar4;
  if (local_128 != (_Manager_type)0x0) {
    (*local_128)(&local_138,&local_138,__destroy_functor);
  }
  if ((CScheduler *)local_100._16_8_ != (CScheduler *)0x0) {
    operator_delete((void *)local_100._16_8_,local_e0.nSatoshisPerK - local_100._16_8_);
  }
  if ((this->m_make_chainman).super__Function_base._M_manager == (_Manager_type)0x0) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      std::__throw_bad_function_call();
LAB_00846486:
      std::terminate();
    }
  }
  else {
    (*(this->m_make_chainman)._M_invoker)((_Any_data *)pfVar1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78.translated._M_dataplus._M_p != &local_78.translated.field_2) {
      operator_delete(local_78.translated._M_dataplus._M_p,
                      CONCAT71(local_78.translated.field_2._M_allocated_capacity._1_7_,
                               local_78.translated.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78.original._M_dataplus._M_p != &local_78.original.field_2) {
      operator_delete(local_78.original._M_dataplus._M_p,
                      CONCAT71(local_78.original.field_2._M_allocated_capacity._1_7_,
                               local_78.original.field_2._M_local_buf[0]) + 1);
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      return;
    }
  }
  __stack_chk_fail();
}

Assistant:

ChainTestingSetup::ChainTestingSetup(const ChainType chainType, TestOpts opts)
    : BasicTestingSetup(chainType, opts)
{
    const CChainParams& chainparams = Params();

    // We have to run a scheduler thread to prevent ActivateBestChain
    // from blocking due to queue overrun.
    if (opts.setup_validation_interface) {
        m_node.scheduler = std::make_unique<CScheduler>();
        m_node.scheduler->m_service_thread = std::thread(util::TraceThread, "scheduler", [&] { m_node.scheduler->serviceQueue(); });
        m_node.validation_signals = std::make_unique<ValidationSignals>(std::make_unique<SerialTaskRunner>(*m_node.scheduler));
    }

    bilingual_str error{};
    m_node.mempool = std::make_unique<CTxMemPool>(MemPoolOptionsForTest(m_node), error);
    Assert(error.empty());
    m_node.warnings = std::make_unique<node::Warnings>();

    m_cache_sizes = CalculateCacheSizes(m_args);

    m_node.notifications = std::make_unique<KernelNotifications>(*Assert(m_node.shutdown), m_node.exit_status, *Assert(m_node.warnings));

    m_make_chainman = [this, &chainparams, opts] {
        Assert(!m_node.chainman);
        ChainstateManager::Options chainman_opts{
            .chainparams = chainparams,
            .datadir = m_args.GetDataDirNet(),
            .check_block_index = 1,
            .notifications = *m_node.notifications,
            .signals = m_node.validation_signals.get(),
            .worker_threads_num = 2,
        };
        if (opts.min_validation_cache) {
            chainman_opts.script_execution_cache_bytes = 0;
            chainman_opts.signature_cache_bytes = 0;
        }
        const BlockManager::Options blockman_opts{
            .chainparams = chainman_opts.chainparams,
            .blocks_dir = m_args.GetBlocksDirPath(),
            .notifications = chainman_opts.notifications,
        };
        m_node.chainman = std::make_unique<ChainstateManager>(*Assert(m_node.shutdown), chainman_opts, blockman_opts);
        LOCK(m_node.chainman->GetMutex());
        m_node.chainman->m_blockman.m_block_tree_db = std::make_unique<BlockTreeDB>(DBParams{
            .path = m_args.GetDataDirNet() / "blocks" / "index",
            .cache_bytes = static_cast<size_t>(m_cache_sizes.block_tree_db),
            .memory_only = true,
        });
    };
    m_make_chainman();
}